

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ipc_address.cpp
# Opt level: O0

int __thiscall zmq::ipc_address_t::resolve(ipc_address_t *this,char *path_)

{
  size_t sVar1;
  int *piVar2;
  char *in_RSI;
  undefined2 *in_RDI;
  size_t path_len;
  int local_4;
  
  sVar1 = strlen(in_RSI);
  if (sVar1 < 0x6c) {
    if ((*in_RSI == '@') && (in_RSI[1] == '\0')) {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      local_4 = -1;
    }
    else {
      *in_RDI = 1;
      memcpy(in_RDI + 1,in_RSI,sVar1 + 1);
      if (*in_RSI == '@') {
        *(undefined1 *)(in_RDI + 1) = 0;
      }
      *(int *)(in_RDI + 0x38) = (int)sVar1 + 2;
      local_4 = 0;
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x24;
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int zmq::ipc_address_t::resolve (const char *path_)
{
    const size_t path_len = strlen (path_);
    if (path_len >= sizeof _address.sun_path) {
        errno = ENAMETOOLONG;
        return -1;
    }
    if (path_[0] == '@' && !path_[1]) {
        errno = EINVAL;
        return -1;
    }

    _address.sun_family = AF_UNIX;
    memcpy (_address.sun_path, path_, path_len + 1);
    /* Abstract sockets start with '\0' */
    if (path_[0] == '@')
        *_address.sun_path = '\0';

    _addrlen =
      static_cast<socklen_t> (offsetof (sockaddr_un, sun_path) + path_len);
    return 0;
}